

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

dtime_tz_t __thiscall
duckdb::Interval::Add(Interval *this,dtime_tz_t left,interval_t right,date_t *date)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = right._0_8_ % 86400000000 + ((ulong)this >> 0x18);
  if (lVar1 < 86400000000) {
    if (-1 < lVar1) goto LAB_0028a261;
    lVar3 = 86400000000;
    iVar2 = -1;
  }
  else {
    iVar2 = 1;
    lVar3 = -86400000000;
  }
  lVar1 = lVar1 + lVar3;
  *(int *)right.micros = *(int *)right.micros + iVar2;
LAB_0028a261:
  return (dtime_tz_t)(lVar1 << 0x18 | (ulong)((uint)this & 0xffffff));
}

Assistant:

dtime_tz_t Interval::Add(dtime_tz_t left, interval_t right, date_t &date) {
	return dtime_tz_t(Interval::Add(left.time(), right, date), left.offset());
}